

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

char * ps_lookup_word(ps_decoder_t *ps,char *word)

{
  dict_t *d;
  s3wid_t wid_00;
  char *pcVar1;
  size_t sVar2;
  dict_t *dict;
  char *phones;
  int local_28;
  int32 j;
  int32 phlen;
  s3wid_t wid;
  char *word_local;
  ps_decoder_t *ps_local;
  
  d = ps->dict;
  wid_00 = dict_wordid(d,word);
  if (wid_00 == -1) {
    ps_local = (ps_decoder_t *)0x0;
  }
  else {
    local_28 = 0;
    for (phones._4_4_ = 0; phones._4_4_ < d->word[wid_00].pronlen; phones._4_4_ = phones._4_4_ + 1)
    {
      pcVar1 = dict_ciphone_str(d,wid_00,phones._4_4_);
      sVar2 = strlen(pcVar1);
      local_28 = local_28 + (int)sVar2 + 1;
    }
    ps_local = (ps_decoder_t *)
               __ckd_calloc__(1,(long)local_28,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
                              ,0x3fd);
    for (phones._4_4_ = 0; phones._4_4_ < d->word[wid_00].pronlen; phones._4_4_ = phones._4_4_ + 1)
    {
      pcVar1 = dict_ciphone_str(d,wid_00,phones._4_4_);
      strcat((char *)ps_local,pcVar1);
      if (phones._4_4_ != d->word[wid_00].pronlen + -1) {
        strcat((char *)ps_local," ");
      }
    }
  }
  return (char *)ps_local;
}

Assistant:

char *
ps_lookup_word(ps_decoder_t *ps, const char *word)
{
    s3wid_t wid;
    int32 phlen, j;
    char *phones;
    dict_t *dict = ps->dict;
    
    wid = dict_wordid(dict, word);
    if (wid == BAD_S3WID)
	return NULL;

    for (phlen = j = 0; j < dict_pronlen(dict, wid); ++j)
        phlen += strlen(dict_ciphone_str(dict, wid, j)) + 1;
    phones = ckd_calloc(1, phlen);
    for (j = 0; j < dict_pronlen(dict, wid); ++j) {
        strcat(phones, dict_ciphone_str(dict, wid, j));
        if (j != dict_pronlen(dict, wid) - 1)
            strcat(phones, " ");
    }
    return phones;
}